

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_Mesh::Read(ON_Mesh *this,ON_BinaryArchive *file)

{
  size_t sVar1;
  ON_BinaryArchive *pOVar2;
  bool bVar3;
  endian eVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ON_MeshParameters *this_00;
  ON_MeshCurvatureStats *this_01;
  ON_2dPoint *pOVar8;
  ON_2dPoint *dst;
  ON_3dPoint *p;
  ON_3fPoint *pOVar9;
  ON_2fPoint *pOVar10;
  double dVar11;
  float local_f0;
  float fStack_ec;
  ON_2fPoint tc;
  ON_2dPoint sp;
  float local_d0;
  double local_c4;
  float local_bc;
  double local_b8;
  double d;
  double m;
  ON_3fPoint P;
  uint vdex;
  uint dvcount;
  bool bHasInvalidDoublePrecisionVertices;
  bool bHasDoublePrecisionVertices;
  bool bHasNgons;
  int Scount;
  bool bFailedCRC;
  size_t sz;
  int b_packed_tex_rotate;
  ON__INT64 local_70;
  ON__INT64 big_value;
  ON__UINT32 tcode;
  uchar b;
  ON_3fPoint local_54;
  float local_48 [2];
  float fbbox [2] [3];
  int fcount;
  int vcount;
  int iStack_20;
  bool rc;
  int i;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_Mesh *this_local;
  
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  Destroy(this);
  i = 0;
  iStack_20 = 0;
  fcount._3_1_ = ON_BinaryArchive::Read3dmChunkVersion(_minor_version,&i,&stack0xffffffffffffffe0);
  if ((fcount._3_1_) && ((i == 1 || (i == 3)))) {
    fbbox[1][2] = 0.0;
    fbbox[1][1] = 0.0;
    if (fcount._3_1_) {
      fcount._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,(ON__INT32 *)(fbbox[1] + 2));
    }
    if (fcount._3_1_ != false) {
      fcount._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,(ON__INT32 *)(fbbox[1] + 1));
    }
    if (fcount._3_1_ != false) {
      fcount._3_1_ = ON_BinaryArchive::ReadInterval
                               (_minor_version,(ON_Interval *)&this->field_0x270);
    }
    if (fcount._3_1_ != false) {
      fcount._3_1_ = ON_BinaryArchive::ReadInterval
                               (_minor_version,(ON_Interval *)&this->field_0x280);
    }
    if (fcount._3_1_ != false) {
      fcount._3_1_ = ON_BinaryArchive::ReadInterval
                               (_minor_version,(ON_Interval *)&this->field_0x240);
    }
    if (fcount._3_1_ != false) {
      fcount._3_1_ = ON_BinaryArchive::ReadInterval
                               (_minor_version,(ON_Interval *)&this->field_0x250);
    }
    if (fcount._3_1_ != false) {
      fcount._3_1_ = ON_BinaryArchive::ReadDouble(_minor_version,2,this->m_srf_scale);
    }
    local_48[0] = 1.0;
    local_48[1] = 1.0;
    fbbox[0][0] = 1.0;
    fbbox[0][1] = -1.0;
    fbbox[0][2] = -1.0;
    fbbox[1][0] = -1.0;
    if (fcount._3_1_ != false) {
      fcount._3_1_ = ON_BinaryArchive::ReadFloat(_minor_version,6,local_48);
    }
    if (fcount._3_1_ != false) {
      if (local_48[0] <= fbbox[0][1]) {
        if (local_48[1] <= fbbox[0][2]) {
          if (fbbox[0][0] <= fbbox[1][0]) {
            ON_3fPoint::ON_3fPoint(&local_54,local_48);
            ON_3dPoint::operator=(&(this->m_vertex_bbox).m_min,&local_54);
            ON_3fPoint::ON_3fPoint((ON_3fPoint *)&tcode,fbbox[0] + 1);
            ON_3dPoint::operator=(&(this->m_vertex_bbox).m_max,(ON_3fPoint *)&tcode);
          }
        }
      }
    }
    if (fcount._3_1_ != false) {
      fcount._3_1_ = ON_BinaryArchive::ReadFloat(_minor_version,6,this->m_nbox[0]);
    }
    if (fcount._3_1_ != false) {
      fcount._3_1_ = ON_BinaryArchive::ReadFloat(_minor_version,4,this->m_tbox[0]);
    }
    vcount = -1;
    if (fcount._3_1_ != false) {
      fcount._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,&vcount);
    }
    if (fcount._3_1_ != false) {
      if (vcount == 0) {
        SetClosed(this,0);
      }
      else if (vcount == 1) {
        SetClosed(this,1);
      }
      else if (vcount == 2) {
        SetClosed(this,1);
      }
    }
    big_value._7_1_ = '\0';
    big_value._0_4_ = 0;
    local_70 = 0;
    if (fcount._3_1_ != false) {
      fcount._3_1_ = ON_BinaryArchive::ReadChar(_minor_version,(ON__UINT8 *)((long)&big_value + 7));
    }
    if (((fcount._3_1_ != false) && (big_value._7_1_ != '\0')) &&
       (fcount._3_1_ = ON_BinaryArchive::BeginRead3dmBigChunk
                                 (_minor_version,(uint *)&big_value,&local_70), fcount._3_1_)) {
      if ((int)big_value == 0x40008000) {
        this_00 = (ON_MeshParameters *)operator_new(0xe0);
        memset(this_00,0,0xe0);
        ON_MeshParameters::ON_MeshParameters(this_00);
        this->m_mesh_parameters = this_00;
        fcount._3_1_ = ON_MeshParameters::Read(this->m_mesh_parameters,_minor_version);
      }
      else {
        fcount._3_1_ = false;
      }
      bVar3 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
      if (!bVar3) {
        fcount._3_1_ = false;
      }
    }
    for (vcount = 0; fcount._3_1_ != false && vcount < 4; vcount = vcount + 1) {
      fcount._3_1_ = ON_BinaryArchive::ReadChar(_minor_version,(ON__UINT8 *)((long)&big_value + 7));
      if ((fcount._3_1_) && (big_value._7_1_ != '\0')) {
        big_value._0_4_ = 0;
        local_70 = 0;
        fcount._3_1_ = ON_BinaryArchive::BeginRead3dmBigChunk
                                 (_minor_version,(uint *)&big_value,&local_70);
        if (fcount._3_1_) {
          if ((int)big_value == 0x40008000) {
            this_01 = (ON_MeshCurvatureStats *)operator_new(0x40);
            ON_MeshCurvatureStats::ON_MeshCurvatureStats(this_01);
            this->m_kstat[vcount] = this_01;
            fcount._3_1_ = ON_MeshCurvatureStats::Read(this->m_kstat[vcount],_minor_version);
          }
          else {
            fcount._3_1_ = false;
          }
          bVar3 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
          if (!bVar3) {
            fcount._3_1_ = false;
          }
        }
      }
    }
    if (fcount._3_1_ != false) {
      fcount._3_1_ = ReadFaceArray(this,(int)fbbox[1][2],(int)fbbox[1][1],_minor_version);
    }
    if (fcount._3_1_ != false) {
      if (i == 1) {
        fcount._3_1_ = Read_1(this,_minor_version);
      }
      else if (i == 3) {
        fcount._3_1_ = Read_2(this,(int)fbbox[1][2],_minor_version);
      }
      else {
        fcount._3_1_ = false;
      }
    }
    if (1 < iStack_20) {
      sz._0_4_ = (uint)(this->m_packed_tex_rotate & 1);
      if (fcount._3_1_ != false) {
        fcount._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,(ON__INT32 *)&sz);
      }
      this->m_packed_tex_rotate = (bool)(-((uint)sz != 0) & 1);
    }
    if ((i == 3) && (2 < iStack_20)) {
      if (fcount._3_1_ != false) {
        fcount._3_1_ = ON_BinaryArchive::ReadUuid(_minor_version,&(this->m_Ttag).m_mapping_id);
      }
      if ((fcount._3_1_ != false) && (0 < (int)fbbox[1][2])) {
        _Scount = 0;
        bHasNgons = false;
        if (fcount._3_1_ != false) {
          fcount._3_1_ = ON_BinaryArchive::ReadCompressedBufferSize
                                   (_minor_version,(size_t *)&Scount);
        }
        if ((fcount._3_1_ != false) && (_Scount != 0)) {
          if (_Scount == (long)(int)fbbox[1][2] * 0x10) {
            ON_SimpleArray<ON_2dPoint>::SetCapacity
                      (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,(long)(int)fbbox[1][2]);
            pOVar2 = _minor_version;
            sVar1 = _Scount;
            if (fcount._3_1_ != false) {
              pOVar8 = ON_SimpleArray<ON_2dPoint>::Array
                                 (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
              fcount._3_1_ = ON_BinaryArchive::ReadCompressedBuffer(pOVar2,sVar1,pOVar8,&bHasNgons);
            }
            if (fcount._3_1_ != false) {
              ON_SimpleArray<ON_2dPoint>::SetCount
                        (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,(int)fbbox[1][2]);
            }
            eVar4 = ON_BinaryArchive::Endian(_minor_version);
            if (eVar4 == big_endian) {
              iVar5 = ON_SimpleArray<ON_2dPoint>::Count
                                (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
              pOVar8 = ON_SimpleArray<ON_2dPoint>::Array
                                 (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
              dst = ON_SimpleArray<ON_2dPoint>::Array(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>)
              ;
              ON_BinaryArchive::ToggleByteOrder((long)(iVar5 << 1),8,pOVar8,dst);
            }
          }
          else {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                       ,0xa6a,"","ON_Mesh::Read - surface parameter buffer size is wrong.");
            if ((((fcount._3_1_ == false) ||
                 (uVar6 = ON_BinaryArchive::ArchiveOpenNURBSVersion(_minor_version),
                 0xbfb2f69 < uVar6)) || ((_Scount & 0xf) != 0)) || (_Scount < 0x10)) {
              fcount._3_1_ = false;
            }
            else {
              dvcount = (uint)(_Scount >> 4);
              ON_SimpleArray<ON_2dPoint>::SetCapacity
                        (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,(long)(int)dvcount);
              pOVar2 = _minor_version;
              sVar1 = _Scount;
              pOVar8 = ON_SimpleArray<ON_2dPoint>::Array
                                 (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
              fcount._3_1_ = ON_BinaryArchive::ReadCompressedBuffer(pOVar2,sVar1,pOVar8,&bHasNgons);
              ON_SimpleArray<ON_2dPoint>::Destroy(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
            }
          }
        }
      }
      if ((3 < iStack_20) &&
         (uVar6 = ON_BinaryArchive::ArchiveOpenNURBSVersion(_minor_version), 0xbf50139 < uVar6)) {
        if (fcount._3_1_ != false) {
          fcount._3_1_ = ON_MappingTag::Read(&this->m_Ttag,_minor_version);
        }
        if (4 < iStack_20) {
          if (fcount._3_1_ != false) {
            fcount._3_1_ = ON_BinaryArchive::ReadChar(_minor_version,&this->m_mesh_is_manifold);
          }
          if (fcount._3_1_ != false) {
            fcount._3_1_ = ON_BinaryArchive::ReadChar(_minor_version,&this->m_mesh_is_oriented);
          }
          if (fcount._3_1_ != false) {
            fcount._3_1_ = ON_BinaryArchive::ReadChar(_minor_version,&this->m_mesh_is_solid);
          }
          if ((fcount._3_1_ != false) && (5 < iStack_20)) {
            vdex._3_1_ = 0;
            fcount._3_1_ = ON_BinaryArchive::ReadBool(_minor_version,(bool *)((long)&vdex + 3));
            if ((fcount._3_1_) && ((vdex._3_1_ & 1) != 0)) {
              fcount._3_1_ = ReadMeshNgons(_minor_version,&this->m_NgonAllocator,&this->m_Ngon);
            }
            if ((fcount._3_1_ != false) && (6 < iStack_20)) {
              vdex._2_1_ = 0;
              fcount._3_1_ = ON_BinaryArchive::ReadBool(_minor_version,(bool *)((long)&vdex + 2));
              vdex._1_1_ = 0;
              if ((vdex._2_1_ & 1) != 0) {
                fcount._3_1_ = ReadMeshDoublePrecisionVertices
                                         (_minor_version,
                                          &(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
                if (fcount._3_1_) {
                  uVar6 = ON_SimpleArray<ON_3dPoint>::UnsignedCount
                                    (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
                  uVar7 = ON_SimpleArray<ON_3fPoint>::UnsignedCount
                                    (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
                  if (uVar6 == uVar7) {
                    P.z = (float)ON_SimpleArray<ON_3dPoint>::UnsignedCount
                                           (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
                    for (P.y = 0.0; (uint)P.y < (uint)P.z; P.y = (float)((int)P.y + 1)) {
                      p = ON_SimpleArray<ON_3dPoint>::operator[]
                                    (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,(uint)P.y);
                      ON_3fPoint::ON_3fPoint((ON_3fPoint *)&m,p);
                      pOVar9 = ON_SimpleArray<ON_3fPoint>::operator[]
                                         (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,(uint)P.y);
                      dVar11 = ON_3fPoint::MaximumCoordinate(pOVar9);
                      d = ABS(dVar11);
                      pOVar9 = ON_SimpleArray<ON_3fPoint>::operator[]
                                         (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,(uint)P.y);
                      join_0x00001240_0x00001200_ = ON_3fPoint::operator-((ON_3fPoint *)&m,pOVar9);
                      local_c4 = sp.y;
                      local_bc = local_d0;
                      local_b8 = ON_3fVector::MaximumCoordinate((ON_3fVector *)&local_c4);
                      local_b8 = ABS(local_b8);
                      if (d * 1e-06 < local_b8) {
                        vdex._1_1_ = 1;
                        ON_SimpleArray<ON_3dPoint>::Destroy
                                  (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
                        break;
                      }
                    }
                  }
                }
                if (fcount._3_1_) {
                  uVar6 = ON_SimpleArray<ON_3dPoint>::UnsignedCount
                                    (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
                  uVar7 = ON_SimpleArray<ON_3fPoint>::UnsignedCount
                                    (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
                  if ((uVar6 == uVar7) && (iStack_20 < 8)) {
                    ON_BoundingBox::Set(&this->m_vertex_bbox,
                                        &(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,0);
                  }
                }
              }
              if ((fcount._3_1_ != false) && (7 < iStack_20)) {
                fcount._3_1_ = ON_BinaryArchive::ReadBoundingBox
                                         (_minor_version,&this->m_vertex_bbox);
              }
              if ((vdex._1_1_ & 1) != 0) {
                ON_BoundingBox::Set(&this->m_vertex_bbox,
                                    &(this->m_V).super_ON_SimpleArray<ON_3fPoint>,0);
              }
            }
          }
        }
      }
    }
    iVar5 = ON_SimpleArray<ON_2dPoint>::Count(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
    if (((((iVar5 == 0) &&
          (iVar5 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>),
          0 < iVar5)) && (bVar3 = HasTextureCoordinates(this), bVar3)) &&
        (((bVar3 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x240), bVar3 &&
          (bVar3 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x250), bVar3)) &&
         ((bVar3 = ON_Interval::IsInterval((ON_Interval *)&this->field_0x270), bVar3 &&
          ((bVar3 = ON_Interval::IsInterval((ON_Interval *)&this->field_0x280), bVar3 &&
           ((this->m_Ttag).m_mapping_crc == 0)))))))) &&
       (bVar3 = ON_UuidIsNil(&(this->m_Ttag).m_mapping_id), bVar3)) {
      ON_SimpleArray<ON_2dPoint>::SetCapacity
                (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,(long)(int)fbbox[1][2]);
      ON_SimpleArray<ON_2dPoint>::SetCount(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,0);
      for (vcount = 0; vcount < (int)fbbox[1][2]; vcount = vcount + 1) {
        pOVar10 = ON_SimpleArray<ON_2fPoint>::operator[]
                            (&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,vcount);
        local_f0 = (*pOVar10).x;
        tc = (ON_2fPoint)(double)local_f0;
        fStack_ec = (*pOVar10).y;
        sp.x = (double)fStack_ec;
        GetSurfaceParametersHelper(this,(double)tc,sp.x,(double *)&tc,&sp.x);
        ON_SimpleArray<ON_2dPoint>::Append
                  (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,(ON_2dPoint *)&tc);
      }
      ON_MappingTag::SetDefaultSurfaceParameterMappingTag(&this->m_Ttag);
    }
  }
  return fcount._3_1_;
}

Assistant:

bool ON_Mesh::Read( ON_BinaryArchive& file )
{
  Destroy();

  int major_version = 0;
  int minor_version = 0;
  int i;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  
  if (rc && (1 == major_version || 3 == major_version) ) 
  {
    int vcount = 0;
    int fcount = 0;

    if (rc) rc = file.ReadInt( &vcount );
    if (rc) rc = file.ReadInt( &fcount );
    if (rc) rc = file.ReadInterval( m_packed_tex_domain[0] );
    if (rc) rc = file.ReadInterval( m_packed_tex_domain[1] );
    if (rc) rc = file.ReadInterval( m_srf_domain[0] );
    if (rc) rc = file.ReadInterval( m_srf_domain[1] );
    if (rc) rc = file.ReadDouble( 2, m_srf_scale );

    float fbbox[2][3] = { { 1.0f, 1.0f, 1.0f }, { -1.0f, -1.0f, -1.0f } };
    if (rc) rc = file.ReadFloat( 6, &fbbox[0][0] );
    if (rc && fbbox[0][0] <= fbbox[1][0] && fbbox[0][1] <= fbbox[1][1] && fbbox[0][2] <= fbbox[1][2] )
    {
      // When minor_version >= 8, m_vertex_bbox will be read from the archive later.
      m_vertex_bbox.m_min = ON_3fPoint(fbbox[0]);
      m_vertex_bbox.m_max = ON_3fPoint(fbbox[1]);
    }

    if (rc) rc = file.ReadFloat( 6, &m_nbox[0][0] );
    if (rc) rc = file.ReadFloat( 4, &m_tbox[0][0] );

    // int value meaning: -1 = unknown 0 = mesh is not closed, 1 = mesh is closed
    i = -1;
    if (rc) rc = file.ReadInt( &i );
    if (rc)
    {
      switch(i)
      {
      case 0: // not closed;
        SetClosed(0);
        break;
      case 1: // closed;
        SetClosed(1);
        break;
      case 2: // 13 April 2010 Dale Lear - "2" value is obsolete but appears in old files
        SetClosed(1);
        break;
      }
    }

    unsigned char b = 0;
    ON__UINT32 tcode=0;
    ON__INT64 big_value=0;
    if (rc) rc = file.ReadChar(&b);
    if (rc && b) 
    {
      // mesh parameters are in an anonymous chunk
      rc = file.BeginRead3dmBigChunk(&tcode,&big_value);
      if (rc) 
      {
        if ( TCODE_ANONYMOUS_CHUNK == tcode )
        {
          m_mesh_parameters = new ON_MeshParameters();
          rc = m_mesh_parameters->Read( file );
        }
        else
          rc = false;
        if (!file.EndRead3dmChunk())
          rc = false;
      }
    }

    for ( i = 0; rc && i < 4; i++ ) 
    {
      rc = file.ReadChar(&b);
      if (rc && b) 
      {
        // m_kstat[i] curvature stats are in an anonymous chunk
        tcode = 0;
        big_value = 0;
        rc = file.BeginRead3dmBigChunk( &tcode, &big_value );
        if (rc) 
        {
          if ( TCODE_ANONYMOUS_CHUNK == tcode )
          {
            m_kstat[i] = new ON_MeshCurvatureStats();
            rc = m_kstat[i]->Read(file);
          }
          else
            rc = false;
          if ( !file.EndRead3dmChunk() )
            rc = false;
        }
      }
    }

    if (rc) rc = ReadFaceArray( vcount, fcount, file );

    if (rc) {
      if ( major_version==1) {
        rc = Read_1(file);
      }
      else if ( major_version == 3 ) {
        rc = Read_2(vcount,file);
      }
      else
        rc = false;
    }

    if ( minor_version >= 2 ) 
    {
      int b_packed_tex_rotate = m_packed_tex_rotate;
      if (rc) rc = file.ReadInt( &b_packed_tex_rotate );
      m_packed_tex_rotate = b_packed_tex_rotate?true:false;
    }

    if ( 3 == major_version )
    {
      if ( minor_version >= 3 )
      {
        // added for minor version 3.3
        if (rc) rc = file.ReadUuid( m_Ttag.m_mapping_id );

        // compressed m_S[]
        if ( rc && vcount > 0 ) 
        {
          size_t sz = 0;
          bool bFailedCRC=false;
          if (rc) rc = file.ReadCompressedBufferSize( &sz );
          if (rc && sz) 
          {
            if ( sz == vcount*sizeof(ON_2dPoint) )
            {
              m_S.SetCapacity(vcount);
              if (rc) rc = file.ReadCompressedBuffer( sz, m_S.Array(), &bFailedCRC );
              if (rc) m_S.SetCount(vcount);
              if (ON::endian::big_endian == file.Endian())
              {
                file.ToggleByteOrder( m_S.Count()*2, 8, m_S.Array(), (void*)m_S.Array() );
              }
            }
            else
            {
              ON_ERROR("ON_Mesh::Read - surface parameter buffer size is wrong.");
              if (    rc
                   && file.ArchiveOpenNURBSVersion() <= 201011049 
                   && 0 == (sz % sizeof(ON_2dPoint))
                   && sz >= sizeof(ON_2dPoint)
                 )
              {
                // Before 201011049 there was a bug that let m_S[] arrays with
                // the wrong size get saved in files. There was also a bug in 
                // the Rhino .OBJ file reader that created meshes with m_S[] 
                // arrays that had the wrong size.  The next 4 lines of code
                // let us read the junk, discard it and then successfully read
                // the rest of the file.
                int Scount = (int)(sz / sizeof(ON_2dPoint));
                m_S.SetCapacity(Scount);
                rc = file.ReadCompressedBuffer( sz, m_S.Array(), &bFailedCRC );
                m_S.Destroy();
              }
              else
              {
                rc = false; // buffer is wrong size
              }
            }
          }
        }
        if ( minor_version >= 4 && file.ArchiveOpenNURBSVersion() >= 200606010 )
        {
          if (rc) rc = m_Ttag.Read(file);
          if ( minor_version >= 5 )
          {
            if (rc) rc = file.ReadChar( &m_mesh_is_manifold );
            if (rc) rc = file.ReadChar( &m_mesh_is_oriented );
            if (rc) rc = file.ReadChar( &m_mesh_is_solid );

            if ( rc && minor_version >= 6 )
            {
              // added n-gons version 3.6
              bool bHasNgons = false;    
              rc =  file.ReadBool(&bHasNgons);
              if (rc && bHasNgons)
                rc = ReadMeshNgons(file, m_NgonAllocator, m_Ngon);
              if (rc && minor_version >= 7)
              {
                bool bHasDoublePrecisionVertices = false;
                rc = file.ReadBool(&bHasDoublePrecisionVertices);
                bool bHasInvalidDoublePrecisionVertices = false;
                if (bHasDoublePrecisionVertices)
                {
                  // Added explicit double precision vertices chunk version 3.7
                  // (used to be on user data)
                  rc = ReadMeshDoublePrecisionVertices(file, m_dV);
                  if (rc && m_dV.UnsignedCount() == m_V.UnsignedCount())
                  {
                    // Validate m_dV[] - some files contain different values for m_V[] and m_dV[].
                    // When this happens, delete m_dV[].
                    const unsigned int dvcount = m_dV.UnsignedCount();
                    for (unsigned int vdex = 0; vdex < dvcount; vdex++)
                    {
                      const ON_3fPoint P(m_dV[vdex]);
                      const double m = fabs(m_V[vdex].MaximumCoordinate());
                      const double d = fabs((P - m_V[vdex]).MaximumCoordinate());
                      if (d <= m*1.0e-6)
                        continue;
                      bHasInvalidDoublePrecisionVertices = true;
                      m_dV.Destroy();
                      break;
                    }
                  }
                  if (rc && m_dV.UnsignedCount() == m_V.UnsignedCount() && minor_version <= 7)
                  {
                    m_vertex_bbox.Set(m_dV, false);
                  }
                }
                if (rc && minor_version >= 8)
                {
                  rc = file.ReadBoundingBox(m_vertex_bbox);
                }
                if (bHasInvalidDoublePrecisionVertices)
                {
                  m_vertex_bbox.Set(m_V, false);
                }
              }
            }
          }
        }
      }
    }

    if (    0 == m_S.Count()
         && m_V.Count() > 0
         && HasTextureCoordinates()
         && m_srf_domain[0].IsIncreasing() 
         && m_srf_domain[1].IsIncreasing() 
         && m_packed_tex_domain[0].IsInterval()
         && m_packed_tex_domain[1].IsInterval()
         && 0 == m_Ttag.m_mapping_crc
         && ON_UuidIsNil(m_Ttag.m_mapping_id)
          ) 
    {
      // This is a mesh from an old file - but there is enough 
      // information to calculate the m_S[] values from the 
      // m_T[] values.
      m_S.SetCapacity(vcount);
      m_S.SetCount(0);
      ON_2dPoint sp;
      ON_2fPoint tc;
      for ( i = 0; i < vcount; i++)
      {
        tc = m_T[i];
        sp.x = tc.x;
        sp.y = tc.y;
        GetSurfaceParametersHelper(*this,sp.x,sp.y,&sp.x,&sp.y);
        m_S.Append(sp);
      }
      m_Ttag.SetDefaultSurfaceParameterMappingTag();
    }
  }

  return rc;
}